

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O0

bool __thiscall Js::AsmJsModuleCompiler::CompileAllFunctions(AsmJsModuleCompiler *this)

{
  AsmJsFunc *func_00;
  bool bVar1;
  int iVar2;
  Type *ppAVar3;
  int local_2c;
  int j;
  AsmJsFunc *func;
  int i;
  int size;
  AsmJsModuleCompiler *this_local;
  
  iVar2 = JsUtil::ReadOnlyList<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_DefaultComparer>::Count
                    (&(this->mFunctionArray).
                      super_ReadOnlyList<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_DefaultComparer>);
  func._0_4_ = 0;
  while( true ) {
    if (iVar2 <= (int)func) {
      return true;
    }
    ppAVar3 = JsUtil::
              List<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(&this->mFunctionArray,(int)func);
    func_00 = *ppAVar3;
    bVar1 = CompileFunction(this,func_00,(int)func);
    if (!bVar1) break;
    AsmJsFunc::Finish(func_00);
    func._0_4_ = (int)func + 1;
  }
  for (local_2c = 0; local_2c <= (int)func; local_2c = local_2c + 1) {
    RevertFunction(this,local_2c);
  }
  return false;
}

Assistant:

bool AsmJsModuleCompiler::CompileAllFunctions()
    {
        const int size = mFunctionArray.Count();

        for (int i = 0; i < size; i++)
        {
            AsmJsFunc* func = mFunctionArray.Item(i);

            if (!CompileFunction(func, i))
            {
                // an error occurred in the function, revert state on all asm.js functions
                for (int j = 0; j <= i; j++)
                {
                    RevertFunction(j);
                }
                return false;
            }
            func->Finish();
        }
        return true;
    }